

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O0

void __thiscall
QPropertyDelayedNotifications::notify(QPropertyDelayedNotifications *this,qsizetype index)

{
  bool bVar1;
  ulong *puVar2;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QPropertyProxyBindingData *delayed;
  QPropertyObserverPointer observer;
  QPropertyObserverPointer local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (ulong *)(in_RDI + 0x18 + in_RSI * 0x18);
  if (((*puVar2 & 1) == 0) && (puVar2[1] != 0)) {
    puVar2[1] = 0;
    local_10.ptr = (QPropertyObserver *)(*puVar2 & 0xfffffffffffffffd);
    *puVar2 = 0;
    bVar1 = QPropertyObserverPointer::operator_cast_to_bool(&local_10);
    if (bVar1) {
      QPropertyObserverPointer::notify
                ((QPropertyObserverPointer *)observer.ptr,(QUntypedPropertyData *)this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void notify(qsizetype index) {
        auto *delayed = delayedProperties + index;
        if (delayed->d_ptr  & QPropertyBindingData::BindingBit)
            return; // already handled
        if (!delayed->originalBindingData)
            return;
        delayed->originalBindingData = nullptr;

        QPropertyObserverPointer observer  { reinterpret_cast<QPropertyObserver *>(delayed->d_ptr & ~QPropertyBindingData::DelayedNotificationBit) };
        delayed->d_ptr = 0;

        if (observer)
            observer.notify(delayed->propertyData);
    }